

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  Mem *pMVar3;
  Vdbe *pVVar4;
  sqlite3_mutex *psVar5;
  sqlite3_stmt *pStmt;
  bool bVar6;
  RtreeNode *pNode;
  uint uVar7;
  int iVar8;
  int iVar9;
  i64 iVar10;
  i64 iVar11;
  _func_int_sqlite3_vtab_cursor_ptr *iValue;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var12;
  Vdbe *p;
  ulong uVar13;
  long lVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  RtreeNode *pLeaf;
  RtreeCell cell;
  RtreeNode *local_70;
  ulong local_68;
  RtreeCell local_60;
  
  if (*(int *)&pVtab[3].field_0xc != 0) {
    return 0x206;
  }
  uVar13 = (ulong)(uint)nData;
  *(int *)&pVtab[2].zErrMsg = *(int *)&pVtab[2].zErrMsg + 1;
  local_60.iRowid = 0;
  iVar9 = 0;
  bVar6 = true;
  if (1 < nData) {
    uVar7 = (uint)(byte)pVtab[1].field_0xd;
    if ((int)(nData - 4U) < (int)(uint)(byte)pVtab[1].field_0xd) {
      uVar7 = nData - 4U;
    }
    local_68 = uVar13;
    if (pVtab[1].field_0xe == '\0') {
      if (0 < (int)uVar7) {
        uVar13 = 0;
        do {
          dVar15 = sqlite3VdbeRealValue(aData[uVar13 + 3]);
          fVar17 = (float)dVar15;
          if (dVar15 < (double)fVar17) {
            fVar17 = (float)(dVar15 * *(double *)(&DAT_00206720 + (ulong)(dVar15 < 0.0) * 8));
          }
          local_60.aCoord[uVar13].f = fVar17;
          dVar15 = sqlite3VdbeRealValue(aData[uVar13 + 4]);
          fVar16 = (float)dVar15;
          if ((double)fVar16 < dVar15) {
            fVar16 = (float)(dVar15 * *(double *)(&DAT_00206730 + (ulong)(dVar15 < 0.0) * 8));
          }
          local_60.aCoord[uVar13 + 1].f = fVar16;
          if (fVar16 < fVar17) goto LAB_001df345;
          uVar13 = uVar13 + 2;
        } while (uVar13 < uVar7);
      }
    }
    else if (0 < (int)uVar7) {
      uVar13 = 0;
      do {
        iVar10 = sqlite3VdbeIntValue(aData[uVar13 + 3]);
        local_60.aCoord[uVar13].i = (int)iVar10;
        iVar11 = sqlite3VdbeIntValue(aData[uVar13 + 4]);
        local_60.aCoord[uVar13 + 1].i = (int)iVar11;
        if ((int)iVar11 < (int)iVar10) goto LAB_001df345;
        uVar13 = uVar13 + 2;
      } while (uVar13 < uVar7);
    }
    pMVar3 = aData[2];
    uVar7._0_2_ = pMVar3->flags;
    uVar7._2_1_ = pMVar3->enc;
    uVar7._3_1_ = pMVar3->eSubtype;
    nData = (int)local_68;
    if ((0xaaaaaaaaU >> (uVar7 & 0x1f) & 1) == 0) {
      iValue = (_func_int_sqlite3_vtab_cursor_ptr *)sqlite3VdbeIntValue(pMVar3);
      pMVar3 = *aData;
      uVar1._0_2_ = pMVar3->flags;
      uVar1._2_1_ = pMVar3->enc;
      uVar1._3_1_ = pMVar3->eSubtype;
      local_60.iRowid = (i64)iValue;
      if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) {
        p_Var12 = (_func_int_sqlite3_vtab_cursor_ptr *)sqlite3VdbeIntValue(pMVar3);
        bVar6 = false;
        iVar9 = 0;
        if (p_Var12 == iValue) goto LAB_001df1b6;
      }
      sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,(sqlite_int64)iValue);
      iVar8 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
      iVar9 = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
      if (iVar8 == 100) {
        if (*(char *)((long)&(pVtab[1].pModule)->xRowid + 6) != '\x05') {
          iVar9 = 0;
          goto LAB_001df34e;
        }
        iVar9 = rtreeDeleteRowid((Rtree *)pVtab,(sqlite3_int64)iValue);
      }
      bVar6 = false;
    }
  }
LAB_001df1b6:
  pMVar3 = *aData;
  uVar2._0_2_ = pMVar3->flags;
  uVar2._2_1_ = pMVar3->enc;
  uVar2._3_1_ = pMVar3->eSubtype;
  if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) == 0) {
    iVar10 = sqlite3VdbeIntValue(pMVar3);
    iVar9 = rtreeDeleteRowid((Rtree *)pVtab,iVar10);
  }
  if ((1 < nData) && (iVar9 == 0)) {
    local_70 = (RtreeNode *)0x0;
    if (bVar6) {
      pVVar4 = (Vdbe *)pVtab[6].pModule;
      iVar9 = vdbeUnbind(pVVar4,1);
      if ((iVar9 == 0) && (psVar5 = pVVar4->db->mutex, psVar5 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar5);
      }
      pVVar4 = (Vdbe *)pVtab[6].pModule;
      iVar9 = vdbeUnbind(pVVar4,2);
      if ((iVar9 == 0) && (psVar5 = pVVar4->db->mutex, psVar5 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar5);
      }
      sqlite3_step((sqlite3_stmt *)pVtab[6].pModule);
      iVar9 = sqlite3_reset((sqlite3_stmt *)pVtab[6].pModule);
      local_60.iRowid = (i64)(pVtab[1].pModule)->xClose;
      *pRowid = local_60.iRowid;
      if (iVar9 != 0) goto LAB_001df355;
    }
    else {
      *pRowid = local_60.iRowid;
    }
    iVar9 = ChooseLeaf((Rtree *)pVtab,&local_60,0,&local_70);
    pNode = local_70;
    if (iVar9 == 0) {
      pVtab[4].nRef = -1;
      iVar8 = rtreeInsertCell((Rtree *)pVtab,local_70,&local_60,0);
      iVar9 = nodeRelease((Rtree *)pVtab,pNode);
      if (iVar8 != 0) {
        iVar9 = iVar8;
      }
      if ((iVar9 == 0) && (iVar9 = 0, *(char *)((long)&pVtab[1].zErrMsg + 1) != '\0')) {
        pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
        sqlite3_bind_int64(pStmt,1,*pRowid);
        if (*(char *)((long)&pVtab[1].zErrMsg + 1) != '\0') {
          lVar14 = 0;
          do {
            sqlite3_bind_value(pStmt,(int)lVar14 + 2,
                               aData[(ulong)(byte)pVtab[1].field_0xd + lVar14 + 3]);
            lVar14 = lVar14 + 1;
          } while ((uint)lVar14 < (uint)*(byte *)((long)&pVtab[1].zErrMsg + 1));
        }
        sqlite3_step(pStmt);
        iVar9 = sqlite3_reset(pStmt);
      }
    }
  }
LAB_001df355:
  rtreeRelease((Rtree *)pVtab);
  return iVar9;
LAB_001df345:
  iVar9 = (int)uVar13 + 1;
LAB_001df34e:
  iVar9 = rtreeConstraintError((Rtree *)pVtab,iVar9);
  goto LAB_001df355;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **aData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}